

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt slang::SVInt::fromPow2Digits
                (bitwidth_t bits,bool isSigned,bool anyUnknown,uint32_t radix,uint32_t shift,
                span<const_slang::logic_t,_18446744073709551615UL> digits)

{
  uint64_t uVar1;
  bitwidth_t bVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *__s;
  ulong uVar3;
  invalid_argument *this;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *paVar7;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  undefined7 in_register_00000031;
  ulong uVar8;
  uint uVar9;
  undefined4 in_register_0000003c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this_00;
  value<fmt::v11::context> *pvVar10;
  int in_R9D;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  SVInt SVar17;
  string_view fmt;
  format_args args;
  string local_78;
  ulong local_58 [2];
  uint32_t local_48;
  
  this_00.val._4_4_ = in_register_0000003c;
  this_00.val._0_4_ = bits;
  bVar2 = (bitwidth_t)CONCAT71(in_register_00000031,isSigned);
  uVar14 = bVar2 + 0x3f >> 6;
  bVar4 = SUB41(radix,0);
  uVar3 = (ulong)((uVar14 << (bVar4 & 0x1fU)) << 3);
  __s = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)operator_new__(uVar3);
  uVar16 = 0;
  memset(__s,0,uVar3);
  *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 **)this_00 = __s;
  *(bitwidth_t *)(this_00.val + 8) = bVar2;
  *(bool *)(this_00.val + 0xc) = anyUnknown;
  *(bool *)(this_00.val + 0xd) = bVar4;
  if (0 < (long)digits._M_extent._M_extent_value._M_extent_value) {
    paVar7 = __s + uVar14;
    uVar8 = (ulong)(uint)~(-1 << ((byte)in_R9D & 0x1f));
    uVar3 = digits._M_extent._M_extent_value._M_extent_value + 1;
    aVar11.values_ = (value<fmt::v11::context> *)0x0;
    pvVar10 = (value<fmt::v11::context> *)0x0;
    do {
      bVar5 = digits._M_ptr[uVar3 - 2].value;
      uVar13 = uVar8;
      if (bVar5 == 0x80) {
        uVar12 = 0;
      }
      else {
        uVar12 = uVar8;
        if (bVar5 != 0x40) {
          if (shift <= bVar5) {
            this = (invalid_argument *)__cxa_allocate_exception(0x10);
            fmt.size_ = 0x24;
            fmt.data_ = (char *)0x1f;
            args.field_1.values_ = aVar11.values_;
            args.desc_ = (unsigned_long_long)local_58;
            local_58[0] = (ulong)bVar5;
            local_48 = shift;
            ::fmt::v11::vformat_abi_cxx11_
                      (&local_78,(v11 *)"Digit {} too large for radix {}",fmt,args);
            std::invalid_argument::invalid_argument(this,(string *)&local_78);
            __cxa_throw(this,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          uVar12 = (ulong)bVar5;
          uVar13 = 0;
        }
      }
      aVar11.args_ = aVar11.args_ | uVar12 << ((byte)uVar16 & 0x3f);
      pvVar10 = (value<fmt::v11::context> *)((ulong)pvVar10 | uVar13 << ((byte)uVar16 & 0x3f));
      uVar16 = uVar16 + in_R9D;
      if (0x3f < uVar16) {
        __s->values_ = (value<fmt::v11::context> *)aVar11;
        if (bVar4 != false) {
          __s[uVar14].values_ = pvVar10;
        }
        __s = __s + 1;
        if (__s == paVar7) goto LAB_0019d687;
        uVar16 = uVar16 - 0x40;
        bVar5 = (byte)in_R9D - (char)uVar16;
        aVar11.values_ = (value<fmt::v11::context> *)(uVar12 >> (bVar5 & 0x3f));
        pvVar10 = (value<fmt::v11::context> *)(uVar13 >> (bVar5 & 0x3f));
      }
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
    if (__s != paVar7) {
      if (aVar11.values_ != (value<fmt::v11::context> *)0x0) {
        __s->values_ = (value<fmt::v11::context> *)aVar11;
      }
      if ((bVar4 != false) && (pvVar10 != (value<fmt::v11::context> *)0x0)) {
        __s[uVar14].values_ = pvVar10;
      }
    }
  }
LAB_0019d687:
  clearUnusedBits((SVInt *)this_00.pVal);
  checkUnknown((SVInt *)this_00.pVal);
  uVar3 = extraout_RDX;
  if (*(bool *)(this_00.val + 0xd) == true) {
    uVar16 = in_R9D * (int)digits._M_extent._M_extent_value;
    if (*(bitwidth_t *)(this_00.val + 8) < (uint)(in_R9D * (int)digits._M_extent._M_extent_value)) {
      uVar16 = *(bitwidth_t *)(this_00.val + 8);
    }
    uVar6 = uVar16 & 0x3f;
    uVar8 = 0;
    bVar5 = 0x3f;
    if (uVar6 != 0) {
      uVar8 = -1L << (sbyte)uVar6;
      bVar5 = (sbyte)uVar6 - 1;
    }
    uVar6 = (uint)(uVar6 == 0);
    uVar15 = (uVar16 >> 6) - uVar6;
    uVar9 = uVar15 + uVar14;
    uVar1 = *this_00.pVal;
    uVar3 = *(ulong *)(uVar1 + (ulong)uVar9 * 8);
    if (uVar3 >> (bVar5 & 0x3f) != 0) {
      *(ulong *)(uVar1 + (ulong)uVar9 * 8) = uVar3 | uVar8;
      if (uVar9 + 1 < uVar14 * 2) {
        memset((void *)((ulong)(uVar9 + 1) * 8 + uVar1),0xff,(ulong)((uVar14 - uVar15) - 2) * 8 + 8)
        ;
      }
      uVar3 = *(ulong *)(uVar1 + (ulong)uVar15 * 8);
      if (uVar3 >> (bVar5 & 0x3f) != 0) {
        *(ulong *)(uVar1 + (ulong)uVar15 * 8) = uVar3 | uVar8;
        if (uVar15 + 1 < uVar14) {
          memset((void *)((ulong)(uVar15 + 1) * 8 + uVar1),0xff,
                 (ulong)((uVar14 - ((uVar16 >> 6) - uVar6)) - 2) * 8 + 8);
        }
      }
      clearUnusedBits((SVInt *)this_00.pVal);
      uVar3 = extraout_RDX_00;
    }
  }
  SVar17.super_SVIntStorage.bitWidth = (int)uVar3;
  SVar17.super_SVIntStorage.signFlag = (bool)(char)(uVar3 >> 0x20);
  SVar17.super_SVIntStorage.unknownFlag = (bool)(char)(uVar3 >> 0x28);
  SVar17.super_SVIntStorage._14_2_ = (short)(uVar3 >> 0x30);
  SVar17.super_SVIntStorage.field_0.val = this_00.val;
  return (SVInt)SVar17.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromPow2Digits(bitwidth_t bits, bool isSigned, bool anyUnknown, uint32_t radix,
                            uint32_t shift, std::span<logic_t const> digits) {

    SVInt result = allocZeroed(bits, isSigned, anyUnknown);

    uint32_t numWords = getNumWords(bits, false);
    uint32_t ones = (1 << shift) - 1;
    uint64_t word = 0;
    uint64_t unknownWord = 0;
    uint64_t* dest = result.pVal;
    uint64_t* endPtr = dest + numWords;
    uint32_t bitPos = 0;

    for (ptrdiff_t i = ptrdiff_t(digits.size()) - 1; i >= 0; i--) {
        logic_t d = digits[size_t(i)];
        uint64_t unknown = 0;
        uint64_t value = d.value;

        if (exactlyEqual(d, logic_t::x)) {
            value = 0;
            unknown = ones;
        }
        else if (exactlyEqual(d, logic_t::z)) {
            value = ones;
            unknown = ones;
        }
        else if (value >= radix) {
            SLANG_THROW(std::invalid_argument(
                fmt::format("Digit {} too large for radix {}", value, radix)));
        }

        word |= value << bitPos;
        unknownWord |= unknown << bitPos;
        bitPos += shift;

        if (bitPos >= BITS_PER_WORD) {
            *dest = word;
            if (anyUnknown)
                *(dest + numWords) = unknownWord;

            dest++;
            if (dest == endPtr)
                break;

            bitPos -= BITS_PER_WORD;
            word = value >> (shift - bitPos);
            unknownWord = unknown >> (shift - bitPos);
        }
    }

    if (dest != endPtr) {
        if (word)
            *dest = word;
        if (anyUnknown && unknownWord)
            *(dest + numWords) = unknownWord;
    }

    result.clearUnusedBits();
    result.checkUnknown();

    if (result.hasUnknown()) {
        // If the most significant bit is X or Z, we need to extend that out to the full range.
        uint32_t givenBits = std::min((uint32_t)digits.size() * shift, result.getBitWidth());
        uint32_t wordBits = givenBits % BITS_PER_WORD;
        uint32_t wordOffset = givenBits / BITS_PER_WORD;
        uint64_t mask = UINT64_MAX;
        if (wordBits)
            mask <<= wordBits;
        else {
            wordBits = 64;
            wordOffset--;
            mask = 0;
        }

        uint32_t topWord = numWords + wordOffset;
        if (result.pVal[topWord] >> (wordBits - 1)) {
            // Unknown bit was set, so now do the extension.
            result.pVal[topWord] |= mask;
            for (topWord++; topWord < numWords * 2; topWord++)
                result.pVal[topWord] = UINT64_MAX;

            if (result.pVal[wordOffset] >> (wordBits - 1)) {
                // The Z bit was set as well, so handle that too.
                result.pVal[wordOffset] |= mask;
                for (wordOffset++; wordOffset < numWords; wordOffset++)
                    result.pVal[wordOffset] = UINT64_MAX;
            }
            result.clearUnusedBits();
        }
    }

    return result;
}